

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

int FFont::SimpleTranslation(BYTE *colorsused,BYTE *translation,BYTE *reverse,double **luminosity)

{
  PalEntry PVar1;
  double dVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  memset(translation,0,0x100);
  *reverse = '\0';
  uVar7 = 1;
  lVar3 = 1;
  do {
    if (colorsused[lVar3] != '\0') {
      lVar5 = (long)(int)uVar7;
      uVar7 = uVar7 + 1;
      reverse[lVar5] = (BYTE)lVar3;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  uVar8 = 1;
  qsort(reverse + 1,(long)(int)(uVar7 - 1),1,compare);
  uVar6 = 0xffffffffffffffff;
  if (-1 < (int)uVar7) {
    uVar6 = (long)(int)uVar7 * 8;
  }
  pdVar4 = (double *)operator_new__(uVar6);
  *luminosity = pdVar4;
  *pdVar4 = 0.0;
  if ((int)uVar7 < 2) {
    dVar9 = 100000000.0;
    dVar11 = 0.0;
  }
  else {
    dVar11 = 0.0;
    dVar10 = 100000000.0;
    do {
      translation[reverse[uVar8]] = (BYTE)uVar8;
      PVar1.field_0 =
           (anon_union_4_2_12391d7c_for_PalEntry_0)GPalette.BaseColors[reverse[uVar8]].field_0.d;
      dVar9 = (double)((uint)PVar1.field_0 & 0xff) * 0.114 +
              (double)((uint)PVar1.field_0 >> 8 & 0xff) * 0.587 +
              (double)((uint)PVar1.field_0 >> 0x10 & 0xff) * 0.299;
      (*luminosity)[uVar8] = dVar9;
      dVar2 = dVar9;
      if (dVar9 <= dVar11) {
        dVar2 = dVar11;
      }
      dVar11 = dVar2;
      if (dVar10 <= dVar9) {
        dVar9 = dVar10;
      }
      uVar8 = uVar8 + 1;
      dVar10 = dVar9;
    } while (uVar7 != uVar8);
  }
  if (1 < (int)uVar7) {
    pdVar4 = *luminosity;
    uVar6 = 1;
    do {
      pdVar4[uVar6] = (pdVar4[uVar6] - dVar9) * (1.0 / (dVar11 - dVar9));
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  return uVar7;
}

Assistant:

int FFont::SimpleTranslation (BYTE *colorsused, BYTE *translation, BYTE *reverse, double **luminosity)
{
	double min, max, diver;
	int i, j;

	memset (translation, 0, 256);

	reverse[0] = 0;
	for (i = 1, j = 1; i < 256; i++)
	{
		if (colorsused[i])
		{
			reverse[j++] = i;
		}
	}

	qsort (reverse+1, j-1, 1, compare);

	*luminosity = new double[j];
	(*luminosity)[0] = 0.0; // [BL] Prevent uninitalized memory
	max = 0.0;
	min = 100000000.0;
	for (i = 1; i < j; i++)
	{
		translation[reverse[i]] = i;

		(*luminosity)[i] = RPART(GPalette.BaseColors[reverse[i]]) * 0.299 +
						   GPART(GPalette.BaseColors[reverse[i]]) * 0.587 +
						   BPART(GPalette.BaseColors[reverse[i]]) * 0.114;
		if ((*luminosity)[i] > max)
			max = (*luminosity)[i];
		if ((*luminosity)[i] < min)
			min = (*luminosity)[i];
	}
	diver = 1.0 / (max - min);
	for (i = 1; i < j; i++)
	{
		(*luminosity)[i] = ((*luminosity)[i] - min) * diver;
	}

	return j;
}